

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CGameConsole::CInstance::OnInput(CInstance *this,CEvent Event)

{
  byte bVar1;
  IConsole *pIVar2;
  IInput *pIVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  undefined4 extraout_var;
  void *dest;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  long in_FS_OFFSET;
  char local_69;
  byte local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [144])Event & (undefined1  [144])0x1) == (undefined1  [144])0x0)
  goto switchD_0013aff3_caseD_cc;
  if (Event.m_Key < 0xcb) {
    if (Event.m_Key != 9) {
      if (Event.m_Key == 0xd) goto LAB_0013b0b2;
      goto switchD_0013aff3_caseD_cc;
    }
    pIVar3 = ((this->m_pGameConsole->super_CComponent).m_pClient)->m_pInput;
    iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x161);
    if ((char)iVar4 == '\0') {
      pIVar3 = ((this->m_pGameConsole->super_CComponent).m_pClient)->m_pInput;
      uVar6 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,0x165);
      local_69 = (char)uVar6;
      uVar6 = -(uVar6 & 0xff) | 1;
    }
    else {
      uVar6 = 0xffffffff;
      local_69 = '\x01';
    }
    if (this->m_Type == 0) {
LAB_0013b28f:
      uVar5 = 0;
LAB_0013b291:
      pIVar2 = this->m_pGameConsole->m_pConsole;
      iVar7 = (*(pIVar2->super_IInterface)._vptr_IInterface[5])
                        (pIVar2,this->m_aCompletionBuffer,(ulong)(uint)this->m_CompletionFlagmask,
                         (ulong)(uVar5 & 0xff),IConsole::EmptyPossibleCommandCallback,0);
      iVar4 = this->m_CompletionChosen;
      if (iVar7 == 0) {
        if (iVar4 != -1) {
          this->m_CompletionChosen = -1;
          this->m_CompletionRenderOffset = 0.0;
          this->m_CompletionRenderOffsetChange = 0.0;
        }
      }
      else {
        iVar14 = 0;
        if (iVar4 != -1) {
          iVar14 = iVar4;
        }
        if (local_69 == '\0') {
          iVar14 = iVar4;
        }
        this->m_CompletionChosen = (int)(iVar7 + uVar6 + iVar14) % iVar7;
        pIVar2 = this->m_pGameConsole->m_pConsole;
        (*(pIVar2->super_IInterface)._vptr_IInterface[5])
                  (pIVar2,this->m_aCompletionBuffer,(ulong)(uint)this->m_CompletionFlagmask,
                   (ulong)(uVar5 & 0xff),PossibleCommandsCompleteCallback,this);
      }
    }
    else {
      iVar4 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                _vptr_IInterface[0x1a])();
      if ((char)iVar4 != '\0') {
        if ((this->m_Type != 1) ||
           (iVar4 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                      super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar4 == '\0'))
        goto LAB_0013b28f;
        uVar5 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface
                  )._vptr_IInterface[0x1b])();
        goto LAB_0013b291;
      }
    }
    if ((this->m_Type == 1) &&
       (iVar4 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface
                  )._vptr_IInterface[0x1a])(), (char)iVar4 != '\0')) {
      pcVar11 = (this->m_Input).m_pStr;
      bVar13 = false;
      lVar9 = 0;
      do {
        pcVar8 = str_startswith_nocase(pcVar11,s_apMapCommands[lVar9]);
        if (bVar13) break;
        lVar9 = 1;
        bVar13 = true;
      } while (pcVar8 == (char *)0x0);
      if (pcVar8 != (char *)0x0) {
        pIVar2 = this->m_pGameConsole->m_pConsole;
        iVar7 = (*(pIVar2->super_IInterface)._vptr_IInterface[6])
                          (pIVar2,this->m_aCompletionMapBuffer,
                           IConsole::EmptyPossibleCommandCallback,0);
        iVar4 = this->m_CompletionMapChosen;
        if (iVar7 == 0) {
          if (iVar4 != -1) {
            this->m_CompletionMapChosen = -1;
            this->m_CompletionRenderOffset = 0.0;
            this->m_CompletionRenderOffsetChange = 0.0;
          }
        }
        else {
          iVar14 = 0;
          if (iVar4 != -1) {
            iVar14 = iVar4;
          }
          if (local_69 == '\0') {
            iVar14 = iVar4;
          }
          this->m_CompletionMapChosen = (int)(uVar6 + iVar7 + iVar14) % iVar7;
          pIVar2 = this->m_pGameConsole->m_pConsole;
          (*(pIVar2->super_IInterface)._vptr_IInterface[6])
                    (pIVar2,this->m_aCompletionMapBuffer,PossibleMapsCompleteCallback,this);
        }
      }
    }
    goto switchD_0013aff3_caseD_cc;
  }
  switch(Event.m_Key) {
  case 0xcb:
    this->m_BacklogActPage = this->m_BacklogActPage + 1;
    break;
  case 0xcc:
  case 0xcd:
  case 0xcf:
  case 0xd0:
    break;
  case 0xce:
    iVar4 = 0;
    if (0 < this->m_BacklogActPage) {
      iVar4 = this->m_BacklogActPage + -1;
    }
    this->m_BacklogActPage = iVar4;
    break;
  case 0xd1:
    if (this->m_pHistoryEntry != (char *)0x0) {
      pcVar11 = (char *)CRingBufferBase::Next
                                  (&(this->m_History).super_CRingBufferBase,this->m_pHistoryEntry);
      this->m_pHistoryEntry = pcVar11;
      if (pcVar11 != (char *)0x0) goto LAB_0013b438;
    }
    CLineInput::Clear(&this->m_Input);
    goto LAB_0013ae8c;
  case 0xd2:
    if (this->m_pHistoryEntry == (char *)0x0) {
      pcVar11 = (char *)CRingBufferBase::Last(&(this->m_History).super_CRingBufferBase);
      this->m_pHistoryEntry = pcVar11;
    }
    else {
      pcVar11 = (char *)CRingBufferBase::Prev
                                  (&(this->m_History).super_CRingBufferBase,this->m_pHistoryEntry);
      if (pcVar11 != (char *)0x0) {
        this->m_pHistoryEntry = pcVar11;
        goto LAB_0013b438;
      }
      pcVar11 = this->m_pHistoryEntry;
    }
    if (pcVar11 == (char *)0x0) goto LAB_0013ae8c;
LAB_0013b438:
    CLineInput::Set(&this->m_Input,pcVar11);
    goto LAB_0013ae8c;
  default:
    if (Event.m_Key == 0xd8) {
LAB_0013b0b2:
      if (*(this->m_Input).m_pStr != '\0') {
        if ((this->m_Type == 0) ||
           (iVar4 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->
                      super_IInterface)._vptr_IInterface[0x1a])(), (char)iVar4 != '\0')) {
          dest = CRingBufferBase::Allocate
                           (&(this->m_History).super_CRingBufferBase,(this->m_Input).m_Len + 1);
          mem_copy(dest,(this->m_Input).m_pStr,(this->m_Input).m_Len + 1);
        }
        ExecuteLine(this,(this->m_Input).m_pStr);
        CLineInput::Clear(&this->m_Input);
        this->m_pHistoryEntry = (char *)0x0;
      }
      goto LAB_0013ae8c;
    }
  }
switchD_0013aff3_caseD_cc:
  CLineInput::ProcessInput(&this->m_Input,&Event);
LAB_0013ae8c:
  if ((Event.m_Flags & 9U) != 0) {
    if (((Event.m_Key != 9) && (Event.m_Key != 0x161)) && (Event.m_Key != 0x165)) {
      this->m_CompletionChosen = -1;
      str_copy(this->m_aCompletionBuffer,(this->m_Input).m_pStr,0x80);
      lVar9 = 0;
      bVar13 = true;
      do {
        bVar12 = bVar13;
        pcVar11 = s_apMapCommands[lVar9];
        pcVar8 = str_startswith_nocase((this->m_Input).m_pStr,pcVar11);
        if (pcVar8 != (char *)0x0) {
          this->m_CompletionMapChosen = -1;
          pcVar8 = (this->m_Input).m_pStr;
          iVar4 = str_length(pcVar11);
          str_copy(this->m_aCompletionMapBuffer,pcVar8 + iVar4,0x80);
        }
        lVar9 = 1;
        bVar13 = false;
      } while (bVar12);
      this->m_CompletionRenderOffset = 0.0;
      this->m_CompletionRenderOffsetChange = 0.0;
    }
    pcVar11 = (this->m_Input).m_pStr;
    uVar10 = 0;
    do {
      bVar1 = pcVar11[uVar10];
      if ((bVar1 & 0xdf) == 0) goto LAB_0013af71;
      local_68[uVar10] = bVar1;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x2f);
    uVar10 = 0x2f;
LAB_0013af71:
    local_68[uVar10 & 0xffffffff] = 0;
    pIVar2 = this->m_pGameConsole->m_pConsole;
    uVar6 = this->m_CompletionFlagmask;
    if ((this->m_Type == 1) &&
       (iVar4 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface
                  )._vptr_IInterface[0x1a])(), (char)iVar4 != '\0')) {
      uVar5 = (*(((this->m_pGameConsole->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                _vptr_IInterface[0x1b])();
    }
    else {
      uVar5 = 0;
    }
    iVar4 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])
                      (pIVar2,local_68,(ulong)uVar6,(ulong)(uVar5 & 0xff));
    lVar9 = CONCAT44(extraout_var,iVar4);
    if (lVar9 == 0) {
      this->m_IsCommand = false;
    }
    else {
      this->m_IsCommand = true;
      str_copy(this->m_aCommandName,*(char **)(lVar9 + 0x10),0x30);
      str_copy(this->m_aCommandHelp,*(char **)(lVar9 + 0x18),0x80);
      str_copy(this->m_aCommandParams,*(char **)(lVar9 + 0x20),0x60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::CInstance::OnInput(IInput::CEvent Event)
{
	bool Handled = false;

	if(Event.m_Flags&IInput::FLAG_PRESS)
	{
		if(Event.m_Key == KEY_RETURN || Event.m_Key == KEY_KP_ENTER)
		{
			if(m_Input.GetString()[0])
			{
				if(m_Type == CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
				{
					char *pEntry = m_History.Allocate(m_Input.GetLength()+1);
					mem_copy(pEntry, m_Input.GetString(), m_Input.GetLength()+1);
				}
				ExecuteLine(m_Input.GetString());
				m_Input.Clear();
				m_pHistoryEntry = 0x0;
			}

			Handled = true;
		}
		else if(Event.m_Key == KEY_UP)
		{
			if(m_pHistoryEntry)
			{
				char *pTest = m_History.Prev(m_pHistoryEntry);

				if(pTest)
					m_pHistoryEntry = pTest;
			}
			else
				m_pHistoryEntry = m_History.Last();

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			Handled = true;
		}
		else if(Event.m_Key == KEY_DOWN)
		{
			if(m_pHistoryEntry)
				m_pHistoryEntry = m_History.Next(m_pHistoryEntry);

			if(m_pHistoryEntry)
				m_Input.Set(m_pHistoryEntry);
			else
				m_Input.Clear();
			Handled = true;
		}
		else if(Event.m_Key == KEY_TAB)
		{
			const int Direction = m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_LSHIFT) || m_pGameConsole->m_pClient->Input()->KeyIsPressed(KEY_RSHIFT) ? -1 : 1;

			// command completion
			if(m_Type == CGameConsole::CONSOLETYPE_LOCAL || m_pGameConsole->Client()->RconAuthed())
			{
				const bool UseTempCommands = m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands();
				const int CompletionEnumerationCount = m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands);
				if(CompletionEnumerationCount)
				{
					if(m_CompletionChosen == -1 && Direction < 0)
						m_CompletionChosen = 0;
					m_CompletionChosen = (m_CompletionChosen + Direction + CompletionEnumerationCount) % CompletionEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleCommands(m_aCompletionBuffer, m_CompletionFlagmask, UseTempCommands, PossibleCommandsCompleteCallback, this);
				}
				else if(m_CompletionChosen != -1)
				{
					m_CompletionChosen = -1;
					Reset();
				}
			}

			// maplist completion
			if(m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && IsMapCommandPrefix(GetString()))
			{
				const int CompletionMapEnumerationCount = m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer);
				if(CompletionMapEnumerationCount)
				{
					if(m_CompletionMapChosen == -1 && Direction < 0)
						m_CompletionMapChosen = 0;
					m_CompletionMapChosen = (m_CompletionMapChosen + Direction + CompletionMapEnumerationCount) % CompletionMapEnumerationCount;
					m_pGameConsole->m_pConsole->PossibleMaps(m_aCompletionMapBuffer, PossibleMapsCompleteCallback, this);
				}
				else if(m_CompletionMapChosen != -1)
				{
					m_CompletionMapChosen = -1;
					Reset();
				}
			}
		}
		else if(Event.m_Key == KEY_PAGEUP)
		{
			++m_BacklogActPage;
		}
		else if(Event.m_Key == KEY_PAGEDOWN)
		{
			--m_BacklogActPage;
			if(m_BacklogActPage < 0)
				m_BacklogActPage = 0;
		}
	}

	if(!Handled)
		m_Input.ProcessInput(Event);

	if(Event.m_Flags&(IInput::FLAG_PRESS|IInput::FLAG_TEXT))
	{
		if(Event.m_Key != KEY_TAB && Event.m_Key != KEY_LSHIFT && Event.m_Key != KEY_RSHIFT)
		{
			m_CompletionChosen = -1;
			str_copy(m_aCompletionBuffer, m_Input.GetString(), sizeof(m_aCompletionBuffer));

			for(unsigned i = 0; i < sizeof(s_apMapCommands) / sizeof(char *); i++)
			{
				if(str_startswith_nocase(GetString(), s_apMapCommands[i]))
				{
					m_CompletionMapChosen = -1;
					str_copy(m_aCompletionMapBuffer, &m_Input.GetString()[str_length(s_apMapCommands[i])], sizeof(m_aCompletionBuffer));
				}
			}
			
			Reset();
		}

		// find the current command
		{
			char aBuf[sizeof(m_aCommandName)];
			const char *pSrc = GetString();
			int i = 0;
			for(; i < (int)sizeof(aBuf)-1 && *pSrc && *pSrc != ' '; i++, pSrc++)
				aBuf[i] = *pSrc;
			aBuf[i] = 0;

			const IConsole::CCommandInfo *pCommand = m_pGameConsole->m_pConsole->GetCommandInfo(aBuf, m_CompletionFlagmask,
				m_Type == CGameConsole::CONSOLETYPE_REMOTE && m_pGameConsole->Client()->RconAuthed() && m_pGameConsole->Client()->UseTempRconCommands());
			if(pCommand)
			{
				m_IsCommand = true;
				str_copy(m_aCommandName, pCommand->m_pName, sizeof(m_aCommandName));
				str_copy(m_aCommandHelp, pCommand->m_pHelp, sizeof(m_aCommandHelp));
				str_copy(m_aCommandParams, pCommand->m_pParams, sizeof(m_aCommandParams));
			}
			else
				m_IsCommand = false;
		}
	}
}